

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGeneratorRcc::MultiConfigOutput_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGeneratorRcc *this)

{
  int iVar1;
  string local_30;
  
  if (MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,"_CMAKE_",
                 (allocator<char> *)&local_30);
      __cxa_atexit(std::__cxx11::string::~string,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  cmQtAutoGen::AppendFilenameSuffix
            (&local_30,&this->RccFileName_,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorRcc::MultiConfigOutput() const
{
  static std::string const suffix = "_CMAKE_";
  std::string res;
  res += RccPathChecksum_;
  res += '/';
  res += AppendFilenameSuffix(RccFileName_, suffix);
  return res;
}